

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_>::rehash
          (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *this,size_t sizeHint)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  QGraphicsObject *pQVar5;
  Node<QGesture_*,_QGraphicsObject_*> *pNVar6;
  ulong uVar7;
  Span *pSVar8;
  size_t index;
  long lVar9;
  size_t numBuckets;
  long lVar10;
  long in_FS_OFFSET;
  R RVar11;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar9 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar11 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar11.spans;
  this->numBuckets = numBuckets;
  pSVar8 = pSVar3;
  for (uVar7 = 0; uVar7 != uVar2 >> 7; uVar7 = uVar7 + 1) {
    for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 1) {
      bVar1 = pSVar8->offsets[lVar9];
      if (bVar1 != 0xff) {
        pEVar4 = pSVar3[uVar7].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::findBucket<QGesture*>
                             ((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)this,
                              (QGesture **)(pEVar4 + bVar1));
        pNVar6 = Bucket::insert(&local_48);
        pEVar4 = pEVar4 + bVar1;
        pQVar5 = *(QGraphicsObject **)((pEVar4->storage).data + 8);
        pNVar6->key = *(QGesture **)(pEVar4->storage).data;
        pNVar6->value = pQVar5;
      }
    }
    Span<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_>::freeData(pSVar3 + uVar7);
    pSVar8 = pSVar8 + 1;
  }
  if (pSVar3 != (Span *)0x0) {
    lVar9 = *(long *)&pSVar3[-1].allocated;
    if (lVar9 != 0) {
      lVar10 = lVar9 * 0x90;
      do {
        Span<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_>::freeData
                  ((Span<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)
                   (pSVar3[-1].offsets + lVar10));
        lVar10 = lVar10 + -0x90;
      } while (lVar10 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar9 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }